

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O0

void log_cart_info(CartInfo *cart_info)

{
  byte bVar1;
  Result value;
  u8 *__s;
  void *pvVar2;
  char *pcVar3;
  int local_48;
  int local_40;
  int i;
  int title_length;
  char *title_end;
  char *title_start;
  uchar title [17];
  CartInfo *cart_info_local;
  
  unique0x10000257 = cart_info;
  memset(&title_start,0,0x11);
  __s = stack0xfffffffffffffff0->data + 0x134;
  pvVar2 = memchr(__s,0,0x10);
  if (pvVar2 == (void *)0x0) {
    local_48 = 0x10;
  }
  else {
    local_48 = (int)pvVar2 - (int)__s;
  }
  memcpy(&title_start,__s,(long)local_48);
  for (local_40 = 0; local_40 < local_48; local_40 = local_40 + 1) {
    if ((title[(long)local_40 + -8] < 0x20) || (0x7f < title[(long)local_40 + -8])) {
      title[(long)local_40 + -8] = ' ';
    }
  }
  printf("title: \"%s\"\n",&title_start);
  pcVar3 = get_cgb_flag_string(stack0xfffffffffffffff0->cgb_flag);
  printf("cgb flag: %s\n",pcVar3);
  pcVar3 = get_sgb_flag_string(stack0xfffffffffffffff0->sgb_flag);
  printf("sgb flag: %s\n",pcVar3);
  pcVar3 = get_cart_type_string(stack0xfffffffffffffff0->cart_type);
  printf("cart type: %s\n",pcVar3);
  pcVar3 = get_rom_size_string(stack0xfffffffffffffff0->rom_size);
  printf("rom size: %s\n",pcVar3);
  pcVar3 = get_ext_ram_size_string(stack0xfffffffffffffff0->ext_ram_size);
  printf("ext ram size: %s\n",pcVar3);
  bVar1 = stack0xfffffffffffffff0->data[0x14d];
  value = validate_header_checksum(stack0xfffffffffffffff0);
  pcVar3 = get_result_string(value);
  printf("header checksum: 0x%02x [%s]\n",(ulong)bVar1,pcVar3);
  return;
}

Assistant:

static void log_cart_info(CartInfo* cart_info) {
  unsigned char title[TITLE_MAX_LENGTH + 1] = {0};
  char* title_start = (char*)cart_info->data + TITLE_START_ADDR;
  char* title_end = memchr(title_start, '\0', TITLE_MAX_LENGTH);
  int title_length =
      (int)(title_end ? title_end - title_start : TITLE_MAX_LENGTH);
  memcpy(title, title_start, title_length);
  // Change all non-ascii characters to ' '.
  int i;
  for (i = 0; i < title_length; ++i) {
    if (title[i] < 32 || title[i] >= 128) { title[i] = ' '; }
  }
  printf("title: \"%s\"\n", title);
  printf("cgb flag: %s\n", get_cgb_flag_string(cart_info->cgb_flag));
  printf("sgb flag: %s\n", get_sgb_flag_string(cart_info->sgb_flag));
  printf("cart type: %s\n", get_cart_type_string(cart_info->cart_type));
  printf("rom size: %s\n", get_rom_size_string(cart_info->rom_size));
  printf("ext ram size: %s\n",
         get_ext_ram_size_string(cart_info->ext_ram_size));
  printf("header checksum: 0x%02x [%s]\n",
         cart_info->data[HEADER_CHECKSUM_ADDR],
         get_result_string(validate_header_checksum(cart_info)));
}